

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.hpp
# Opt level: O2

unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>
qclab::dense::init_unique_array<std::complex<double>>(int64_t size,complex<double> value)

{
  _Head_base<0UL,_std::complex<double>_*,_false> _Var1;
  long lVar2;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> mem;
  _Head_base<0UL,_std::complex<double>_*,_false> local_20;
  
  alloc_unique_array<std::complex<double>>((dense *)&local_20,value._M_value._0_8_);
  _Var1._M_head_impl = local_20._M_head_impl;
  for (lVar2 = value._M_value._0_8_ << 4; lVar2 != 0; lVar2 = lVar2 + -0x10) {
    *(undefined8 *)(_Var1._M_head_impl)->_M_value = in_XMM0_Qa;
    *(undefined8 *)((_Var1._M_head_impl)->_M_value + 8) = in_XMM1_Qa;
    _Var1._M_head_impl = _Var1._M_head_impl + 1;
  }
  *(complex<double> **)size = local_20._M_head_impl;
  local_20._M_head_impl = (complex<double> *)0x0;
  std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::~unique_ptr
            ((unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_> *)
             &local_20);
  return (__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
          )(__uniq_ptr_data<std::complex<double>,_std::default_delete<std::complex<double>[]>,_true,_true>
            )size;
}

Assistant:

inline auto init_unique_array( const int64_t size , const T value ) {
      auto mem = alloc_unique_array< T >( size ) ;
      std::fill( mem.get() , mem.get() + size , value ) ;
      return mem ;
    }